

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

void gray_record_cell(PWorker worker)

{
  int iVar1;
  long lVar2;
  long lVar3;
  PCell *ppTVar4;
  PCell_conflict pTVar5;
  PCell_conflict pTVar6;
  long lVar7;
  
  lVar2 = worker->area;
  iVar1 = worker->cover;
  if (lVar2 != 0 || iVar1 != 0) {
    lVar3 = worker->count_ex;
    if (worker->ex < worker->count_ex) {
      lVar3 = worker->ex;
    }
    ppTVar4 = worker->ycells + worker->ey;
    pTVar6 = *ppTVar4;
    if ((pTVar6 != (PCell_conflict)0x0) && (lVar7 = (long)pTVar6->x, lVar7 <= lVar3)) {
      do {
        pTVar5 = pTVar6;
        if (lVar3 == lVar7) goto LAB_00122589;
        pTVar6 = pTVar5->next;
      } while ((pTVar6 != (PCell)0x0) && (lVar7 = (long)pTVar6->x, lVar7 <= lVar3));
      ppTVar4 = &pTVar5->next;
    }
    lVar7 = worker->num_cells;
    if (worker->max_cells <= lVar7) {
      longjmp((__jmp_buf_tag *)worker->jump_buffer,1);
    }
    worker->num_cells = lVar7 + 1;
    pTVar5 = worker->cells + lVar7;
    pTVar5->x = (int)lVar3;
    pTVar5->area = 0;
    pTVar5->cover = 0;
    pTVar5->next = pTVar6;
    *ppTVar4 = pTVar5;
LAB_00122589:
    pTVar5->area = pTVar5->area + lVar2;
    pTVar5->cover = pTVar5->cover + iVar1;
  }
  return;
}

Assistant:

static void
  gray_record_cell( RAS_ARG )
  {
    if ( ras.area | ras.cover )
    {
      PCell  cell = gray_find_cell( RAS_VAR );


      cell->area  += ras.area;
      cell->cover += ras.cover;
    }
  }